

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddSharedLibNoSOName(cmComputeLinkInformation *this,string *item)

{
  undefined1 local_38 [8];
  string file;
  string *item_local;
  cmComputeLinkInformation *this_local;
  
  file.field_2._8_8_ = item;
  cmsys::SystemTools::GetFilenameName((string *)local_38,item);
  AddUserItem(this,(string *)local_38,false);
  cmOrderDirectories::AddLinkLibrary(this->OrderLinkerSearchPath,(string *)file.field_2._8_8_);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmComputeLinkInformation::AddSharedLibNoSOName(std::string const& item)
{
  // We have a full path to a shared library with no soname.  We need
  // to ask the linker to locate the item because otherwise the path
  // we give to it will be embedded in the target linked.  Then at
  // runtime the dynamic linker will search for the library using the
  // path instead of just the name.
  std::string file = cmSystemTools::GetFilenameName(item);
  this->AddUserItem(file, false);

  // Make sure the link directory ordering will find the library.
  this->OrderLinkerSearchPath->AddLinkLibrary(item);
}